

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void xPredIntraAngAdi_XY_14(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  pel *dst1;
  pel *ppVar13;
  long lVar14;
  long lVar15;
  byte *pbVar16;
  ulong uVar17;
  long lVar18;
  size_t __n;
  pel first_line [320];
  undefined1 auStack_178 [328];
  int iVar7;
  
  if (iHeight == 4) {
    if (0 < iWidth) {
      lVar10 = (long)i_dst;
      uVar17 = 0;
      do {
        dst[uVar17] = (pel)((uint)pSrc[uVar17 + 2] + (uint)pSrc[uVar17 + 2] * 2 +
                            ((uint)pSrc[uVar17 + 1] * 8 - (uint)pSrc[uVar17 + 1]) +
                            (uint)pSrc[uVar17] + (uint)pSrc[uVar17] * 4 + (uint)pSrc[uVar17 - 1] + 8
                           >> 4);
        dst[uVar17 + lVar10] =
             (pel)((uint)pSrc[uVar17 + 2] + (uint)pSrc[uVar17 - 1] +
                   ((uint)pSrc[uVar17 + 1] + (uint)pSrc[uVar17]) * 3 + 4 >> 3);
        dst[uVar17 + lVar10 * 2] =
             (pel)((uint)pSrc[uVar17 + 2] +
                   (uint)pSrc[uVar17 + 1] + (uint)pSrc[uVar17 + 1] * 4 +
                   (uint)pSrc[uVar17 - 1] + (uint)pSrc[uVar17 - 1] * 2 +
                   ((uint)pSrc[uVar17] * 8 - (uint)pSrc[uVar17]) + 8 >> 4);
        dst[uVar17 + lVar10 * 3] =
             (pel)((uint)pSrc[uVar17 - 1] + (uint)pSrc[uVar17] * 2 + (uint)pSrc[uVar17 + 1] + 2 >> 2
                  );
        uVar17 = uVar17 + 1;
      } while ((uint)iWidth != uVar17);
    }
  }
  else {
    iVar7 = iHeight + 3;
    if (-1 < iHeight) {
      iVar7 = iHeight;
    }
    uVar6 = iVar7 >> 2;
    uVar12 = (uVar6 + iWidth) - 1;
    uVar11 = uVar6 - 1;
    uVar8 = uVar6 + iWidth + 0xe & 0xfffffff0;
    lVar15 = (long)(int)uVar8;
    lVar10 = (long)(int)(uVar8 * 2) + -0x178;
    lVar5 = (long)(int)(uVar8 * 3) + -0x178;
    pbVar16 = pSrc + -(long)(iHeight + -4);
    if ((int)uVar11 < 1) {
      uVar9 = 0;
    }
    else {
      bVar1 = *pbVar16;
      lVar14 = 0;
      uVar17 = 0;
      do {
        uVar9 = (uint)bVar1;
        bVar2 = pbVar16[uVar17 * 4 + 2];
        bVar3 = pbVar16[uVar17 * 4 + 3];
        bVar1 = pbVar16[uVar17 * 4 + 4];
        auStack_178[uVar17] = (char)((uint)bVar2 + (uint)bVar3 * 2 + 2 + (uint)bVar1 >> 2);
        bVar4 = pbVar16[uVar17 * 4 + 1];
        auStack_178[uVar17 + lVar15] = (char)(bVar4 + 2 + (uint)bVar2 * 2 + (uint)bVar3 >> 2);
        auStack_178[uVar17 + lVar10 + 0x178] =
             (char)((uint)bVar2 + (uint)bVar4 * 2 + 2 + uVar9 >> 2);
        auStack_178[uVar17 + lVar5 + 0x178] =
             (char)(bVar4 + 2 + uVar9 * 2 + (uint)pbVar16[uVar17 * 4 + -1] >> 2);
        uVar17 = uVar17 + 1;
        lVar14 = lVar14 + -4;
      } while (uVar11 != uVar17);
      pbVar16 = pbVar16 + -lVar14;
      uVar9 = uVar11;
    }
    if ((int)uVar9 < (int)uVar12) {
      uVar17 = (ulong)uVar9;
      lVar14 = 0;
      do {
        bVar1 = pbVar16[lVar14 + -1];
        bVar2 = pbVar16[lVar14];
        bVar3 = pbVar16[lVar14 + 1];
        bVar4 = pbVar16[lVar14 + 2];
        auStack_178[lVar14 + uVar17] =
             (char)((uint)bVar4 + (uint)bVar4 * 2 +
                    (uint)bVar2 + (uint)bVar2 * 4 + (uint)bVar1 + ((uint)bVar3 * 8 - (uint)bVar3) +
                    8 >> 4);
        auStack_178[lVar14 + lVar15 + uVar17] =
             (char)(((uint)bVar3 + (uint)bVar2) * 3 + (uint)bVar4 + (uint)bVar1 + 4 >> 3);
        auStack_178[lVar14 + (long)(int)(uVar8 * 2) + uVar17] =
             (char)((uint)bVar4 +
                    (uint)bVar3 + (uint)bVar3 * 4 + (uint)bVar1 + (uint)bVar1 * 2 +
                    ((uint)bVar2 * 8 - (uint)bVar2) + 8 >> 4);
        auStack_178[lVar14 + (long)(int)(uVar8 * 3) + uVar17] =
             (char)((uint)bVar1 + (uint)bVar2 * 2 + (uint)bVar3 + 2 >> 2);
        lVar14 = lVar14 + 1;
      } while (uVar12 - uVar17 != lVar14);
    }
    if (3 < iHeight) {
      lVar14 = (long)(int)uVar11;
      __n = (size_t)iWidth;
      lVar18 = 0;
      do {
        memcpy(dst,auStack_178 + lVar18 + lVar14,__n);
        ppVar13 = dst + i_dst;
        memcpy(ppVar13,auStack_178 + lVar18 + lVar14 + lVar15,__n);
        ppVar13 = ppVar13 + i_dst;
        memcpy(ppVar13,auStack_178 + lVar18 + lVar14 + lVar10 + 0x178,__n);
        memcpy(ppVar13 + i_dst,auStack_178 + lVar18 + lVar14 + lVar5 + 0x178,__n);
        dst = ppVar13 + i_dst + i_dst;
        lVar18 = lVar18 + -1;
      } while (-lVar18 != (ulong)uVar6);
    }
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_14(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    int i;

    if (iHeight != 4) {
        ALIGNED_16(pel first_line[4 * (64 + 16)]);
        int line_size = iWidth + iHeight / 4 - 1;
        int left_size = line_size - iWidth;
        int aligned_line_size = ((line_size + 15) >> 4) << 4;
        pel *pfirst[4] = { first_line, first_line + aligned_line_size, first_line + aligned_line_size * 2, first_line + aligned_line_size * 3 };

        pSrc -= iHeight - 4;
        for (i = 0; i < left_size; i++, pSrc += 4) {
            pfirst[0][i] = (pSrc[2] + pSrc[3] * 2 + pSrc[4] + 2) >> 2;
            pfirst[1][i] = (pSrc[1] + pSrc[2] * 2 + pSrc[3] + 2) >> 2;
            pfirst[2][i] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
            pfirst[3][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
        }

        for (; i < line_size; i++, pSrc++) {
            pfirst[0][i] = (pSrc[-1] + pSrc[0] * 5 + pSrc[1] * 7 + pSrc[2] * 3 + 8) >> 4;
            pfirst[1][i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
            pfirst[2][i] = (pSrc[-1] * 3 + pSrc[0] * 7 + pSrc[1] * 5 + pSrc[2] + 8) >> 4;
            pfirst[3][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
        }

        pfirst[0] += left_size;
        pfirst[1] += left_size;
        pfirst[2] += left_size;
        pfirst[3] += left_size;

        iHeight /= 4;

        for (i = 0; i < iHeight; i++) {
            memcpy(dst, pfirst[0] - i, iWidth * sizeof(pel));
            dst += i_dst;
            memcpy(dst, pfirst[1] - i, iWidth * sizeof(pel));
            dst += i_dst;
            memcpy(dst, pfirst[2] - i, iWidth * sizeof(pel));
            dst += i_dst;
            memcpy(dst, pfirst[3] - i, iWidth * sizeof(pel));
            dst += i_dst;
        }
    }
    else {
        pel *dst1 = dst;
        pel *dst2 = dst1 + i_dst;
        pel *dst3 = dst2 + i_dst;
        pel *dst4 = dst3 + i_dst;

        for (i = 0; i < iWidth; i++, pSrc++) {
            dst1[i] = (pSrc[-1] + pSrc[0] * 5 + pSrc[1] * 7 + pSrc[2] * 3 + 8) >> 4;
            dst2[i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
            dst3[i] = (pSrc[-1] * 3 + pSrc[0] * 7 + pSrc[1] * 5 + pSrc[2] + 8) >> 4;
            dst4[i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
        }
    }
}